

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<14U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<39U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<151U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<84U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<6U,_Fixpp::Type::Float>_>,_Fixpp::TagT<103U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed>
* __thiscall
llvm::
SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<14U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<39U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<151U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<84U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<6U,_Fixpp::Type::Float>_>,_Fixpp::TagT<103U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed>
::operator=(SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<14U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<39U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<151U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<84U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<6U,_Fixpp::Type::Float>_>,_Fixpp::TagT<103U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed>
            *this,SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<14U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<39U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<151U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<84U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<6U,_Fixpp::Type::Float>_>,_Fixpp::TagT<103U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed>
                  *RHS)

{
  undefined4 *puVar1;
  undefined8 uVar2;
  ulong uVar3;
  long lVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  undefined4 *puVar7;
  ulong MinSize;
  undefined8 *puVar8;
  ulong uVar9;
  ulong uVar10;
  
  if (this == RHS) {
    return this;
  }
  puVar5 = (undefined8 *)
           (RHS->
           super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<14U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<39U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<151U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<84U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<6U,_Fixpp::Type::Float>_>,_Fixpp::TagT<103U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed,_false>
           ).
           super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<14U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<39U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<151U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<84U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<6U,_Fixpp::Type::Float>_>,_Fixpp::TagT<103U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed,_void>
           .super_SmallVectorBase.BeginX;
  puVar8 = (undefined8 *)
           (RHS->
           super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<14U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<39U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<151U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<84U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<6U,_Fixpp::Type::Float>_>,_Fixpp::TagT<103U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed,_false>
           ).
           super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<14U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<39U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<151U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<84U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<6U,_Fixpp::Type::Float>_>,_Fixpp::TagT<103U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed,_void>
           .super_SmallVectorBase.EndX;
  uVar10 = (long)puVar8 - (long)puVar5;
  MinSize = ((long)uVar10 >> 3) * -0x5555555555555555;
  puVar7 = (undefined4 *)
           (this->
           super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<14U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<39U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<151U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<84U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<6U,_Fixpp::Type::Float>_>,_Fixpp::TagT<103U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed,_false>
           ).
           super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<14U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<39U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<151U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<84U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<6U,_Fixpp::Type::Float>_>,_Fixpp::TagT<103U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed,_void>
           .super_SmallVectorBase.BeginX;
  puVar1 = (undefined4 *)
           (this->
           super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<14U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<39U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<151U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<84U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<6U,_Fixpp::Type::Float>_>,_Fixpp::TagT<103U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed,_false>
           ).
           super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<14U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<39U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<151U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<84U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<6U,_Fixpp::Type::Float>_>,_Fixpp::TagT<103U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed,_void>
           .super_SmallVectorBase.EndX;
  uVar3 = (long)puVar1 - (long)puVar7;
  uVar9 = ((long)uVar3 >> 3) * -0x5555555555555555;
  if (MinSize <= uVar9) {
    if (0 < (long)uVar10 && puVar8 != puVar5) {
      uVar3 = uVar10 / 0x18 + 1;
      do {
        *puVar7 = *(undefined4 *)puVar5;
        *(undefined8 *)(puVar7 + 2) = puVar5[1];
        *(undefined8 *)(puVar7 + 4) = puVar5[2];
        puVar5 = puVar5 + 3;
        puVar7 = puVar7 + 6;
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    goto LAB_0046083b;
  }
  if ((ulong)((long)(this->
                    super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<14U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<39U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<151U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<84U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<6U,_Fixpp::Type::Float>_>,_Fixpp::TagT<103U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed,_false>
                    ).
                    super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<14U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<39U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<151U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<84U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<6U,_Fixpp::Type::Float>_>,_Fixpp::TagT<103U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed,_void>
                    .super_SmallVectorBase.CapacityX - (long)puVar7) < uVar10) {
    (this->
    super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<14U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<39U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<151U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<84U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<6U,_Fixpp::Type::Float>_>,_Fixpp::TagT<103U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed,_false>
    ).
    super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<14U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<39U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<151U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<84U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<6U,_Fixpp::Type::Float>_>,_Fixpp::TagT<103U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed,_void>
    .super_SmallVectorBase.EndX = puVar7;
    SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<14U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<39U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<151U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<84U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<6U,_Fixpp::Type::Float>_>,_Fixpp::TagT<103U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed,_false>
    ::grow(&this->
            super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<14U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<39U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<151U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<84U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<6U,_Fixpp::Type::Float>_>,_Fixpp::TagT<103U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed,_false>
           ,MinSize);
    puVar5 = (undefined8 *)
             (RHS->
             super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<14U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<39U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<151U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<84U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<6U,_Fixpp::Type::Float>_>,_Fixpp::TagT<103U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed,_false>
             ).
             super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<14U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<39U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<151U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<84U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<6U,_Fixpp::Type::Float>_>,_Fixpp::TagT<103U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed,_void>
             .super_SmallVectorBase.BeginX;
    puVar8 = (undefined8 *)
             (RHS->
             super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<14U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<39U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<151U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<84U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<6U,_Fixpp::Type::Float>_>,_Fixpp::TagT<103U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed,_false>
             ).
             super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<14U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<39U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<151U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<84U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<6U,_Fixpp::Type::Float>_>,_Fixpp::TagT<103U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed,_void>
             .super_SmallVectorBase.EndX;
    puVar7 = (undefined4 *)
             (this->
             super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<14U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<39U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<151U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<84U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<6U,_Fixpp::Type::Float>_>,_Fixpp::TagT<103U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed,_false>
             ).
             super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<14U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<39U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<151U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<84U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<6U,_Fixpp::Type::Float>_>,_Fixpp::TagT<103U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed,_void>
             .super_SmallVectorBase.BeginX;
LAB_00460806:
    uVar9 = 0;
  }
  else {
    if (puVar1 == puVar7) goto LAB_00460806;
    if (0 < (long)uVar3) {
      uVar3 = uVar3 / 0x18 + 1;
      lVar4 = 0;
      do {
        *(undefined4 *)((long)puVar7 + lVar4) = *(undefined4 *)((long)puVar5 + lVar4);
        *(undefined8 *)((long)puVar7 + lVar4 + 8) = *(undefined8 *)((long)puVar5 + lVar4 + 8);
        *(undefined8 *)((long)puVar7 + lVar4 + 0x10) = *(undefined8 *)((long)puVar5 + lVar4 + 0x10);
        uVar3 = uVar3 - 1;
        lVar4 = lVar4 + 0x18;
      } while (1 < uVar3);
    }
  }
  puVar5 = puVar5 + uVar9 * 3;
  if (puVar5 != puVar8) {
    puVar6 = (undefined8 *)(puVar7 + uVar9 * 6);
    do {
      puVar6[2] = puVar5[2];
      uVar2 = puVar5[1];
      *puVar6 = *puVar5;
      puVar6[1] = uVar2;
      puVar5 = puVar5 + 3;
      puVar6 = puVar6 + 3;
    } while (puVar5 != puVar8);
    puVar7 = (undefined4 *)
             (this->
             super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<14U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<39U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<151U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<84U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<6U,_Fixpp::Type::Float>_>,_Fixpp::TagT<103U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed,_false>
             ).
             super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<14U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<39U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<151U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<84U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<6U,_Fixpp::Type::Float>_>,_Fixpp::TagT<103U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed,_void>
             .super_SmallVectorBase.BeginX;
  }
  puVar7 = (undefined4 *)((long)puVar7 + uVar10);
LAB_0046083b:
  (this->
  super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<14U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<39U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<151U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<84U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<6U,_Fixpp::Type::Float>_>,_Fixpp::TagT<103U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed,_false>
  ).
  super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<14U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<39U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<151U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<84U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<6U,_Fixpp::Type::Float>_>,_Fixpp::TagT<103U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed,_void>
  .super_SmallVectorBase.EndX = puVar7;
  return this;
}

Assistant:

SmallVectorImpl<T> &SmallVectorImpl<T>::
  operator=(const SmallVectorImpl<T> &RHS) {
  // Avoid self-assignment.
  if (this == &RHS) return *this;

  // If we already have sufficient space, assign the common elements, then
  // destroy any excess.
  size_t RHSSize = RHS.size();
  size_t CurSize = this->size();
  if (CurSize >= RHSSize) {
    // Assign common elements.
    iterator NewEnd;
    if (RHSSize)
      NewEnd = std::copy(RHS.begin(), RHS.begin()+RHSSize, this->begin());
    else
      NewEnd = this->begin();

    // Destroy excess elements.
    this->destroy_range(NewEnd, this->end());

    // Trim.
    this->setEnd(NewEnd);
    return *this;
  }

  // If we have to grow to have enough elements, destroy the current elements.
  // This allows us to avoid copying them during the grow.
  // FIXME: don't do this if they're efficiently moveable.
  if (this->capacity() < RHSSize) {
    // Destroy current elements.
    this->destroy_range(this->begin(), this->end());
    this->setEnd(this->begin());
    CurSize = 0;
    this->grow(RHSSize);
  } else if (CurSize) {
    // Otherwise, use assignment for the already-constructed elements.
    std::copy(RHS.begin(), RHS.begin()+CurSize, this->begin());
  }

  // Copy construct the new elements in place.
  this->uninitialized_copy(RHS.begin()+CurSize, RHS.end(),
                           this->begin()+CurSize);

  // Set end.
  this->setEnd(this->begin()+RHSSize);
  return *this;
}